

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

SymOpnd * __thiscall Func::GetNextInlineeFrameArgCountSlotOpnd(Func *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SymOpnd *pSVar4;
  undefined8 uVar5;
  
  if ((this->field_0x240 & 2) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x1fd,"(!this->m_hasInlineArgsOpt)","!this->m_hasInlineArgsOpt");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((this->field_0x240 & 2) == 0) {
    pSVar4 = GetInlineeOpndAtOffset(this,(uint)this->actualCount * 8 + 0x18);
    return pSVar4;
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&Js::OperationAbortedException::typeinfo,0);
}

Assistant:

IR::SymOpnd *GetNextInlineeFrameArgCountSlotOpnd()
    {
        Assert(!this->m_hasInlineArgsOpt);
        if (this->m_hasInlineArgsOpt)
        {
            // If the function has inlineArgsOpt turned on, jitted code will not write to stack slots for inlinee's function object
            // and arguments, until needed. If we attempt to read from those slots, we may be reading uninitialized memory.
            throw Js::OperationAbortedException();
        }
        return GetInlineeOpndAtOffset((Js::Constants::InlineeMetaArgCount + actualCount) * MachPtr);
    }